

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall gmath::Camera::Camera(Camera *this)

{
  undefined8 *in_RDI;
  double dVar1;
  
  *in_RDI = &PTR__Camera_001f9800;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)(in_RDI + 7));
  SVector<double,_3>::SVector((SVector<double,_3> *)(in_RDI + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c0d1f);
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[0x13] = 0;
  dVar1 = std::numeric_limits<double>::max();
  in_RDI[0x14] = dVar1;
  return;
}

Assistant:

Camera() { width=0; height=0; zmin=0; zmax=std::numeric_limits<double>::max(); }